

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  bool bVar1;
  
  bVar1 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>>
                    (&this->value_);
  if (bVar1) {
    if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
      bVar1 = EnumOptions::IsInitialized(this->options_);
      if (!bVar1) goto LAB_002be410;
    }
    bVar1 = true;
  }
  else {
LAB_002be410:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->value())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}